

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tetgen.cxx
# Opt level: O0

void __thiscall
tetgenmesh::lu_solve(tetgenmesh *this,double (*lu) [4],int n,int *ps,double *b,int N)

{
  int iVar1;
  double local_70;
  double dot;
  double X [4];
  int local_3c;
  int local_38;
  int j;
  int i;
  int N_local;
  double *b_local;
  int *ps_local;
  int n_local;
  double (*lu_local) [4];
  tetgenmesh *this_local;
  
  for (local_38 = N; iVar1 = N, local_38 < n + N; local_38 = local_38 + 1) {
    X[(long)local_38 + -1] = 0.0;
  }
  while (local_38 = iVar1, local_38 < n + N) {
    local_70 = 0.0;
    for (local_3c = N; local_3c < local_38 + N; local_3c = local_3c + 1) {
      local_70 = lu[ps[local_38]][local_3c] * X[(long)local_3c + -1] + local_70;
    }
    X[(long)local_38 + -1] = b[ps[local_38]] - local_70;
    iVar1 = local_38 + 1;
  }
  local_3c = n + N;
  while (local_38 = local_3c + -1, iVar1 = N, N <= local_38) {
    local_70 = 0.0;
    for (; local_3c < n + N; local_3c = local_3c + 1) {
      local_70 = lu[ps[local_38]][local_3c] * X[(long)local_3c + -1] + local_70;
    }
    X[(long)local_38 + -1] = (X[(long)local_38 + -1] - local_70) / lu[ps[local_38]][local_38];
    local_3c = local_38;
  }
  while (local_38 = iVar1, local_38 < n + N) {
    b[local_38] = X[(long)local_38 + -1];
    iVar1 = local_38 + 1;
  }
  return;
}

Assistant:

void tetgenmesh::lu_solve(REAL lu[4][4], int n, int* ps, REAL* b, int N)
{
  int i, j;
  REAL X[4], dot;

  for (i = N; i < n + N; i++) X[i] = 0.0;

  // Vector reduction using U triangular matrix.
  for (i = N; i < n + N; i++) {
    dot = 0.0;
    for (j = N; j < i + N; j++)
      dot += lu[ps[i]][j] * X[j];
    X[i] = b[ps[i]] - dot;
  }

  // Back substitution, in L triangular matrix.
  for (i = n + N - 1; i >= N; i--) {
    dot = 0.0;
    for (j = i + 1; j < n + N; j++)
      dot += lu[ps[i]][j] * X[j];
    X[i] = (X[i] - dot) / lu[ps[i]][i];
  }

  for (i = N; i < n + N; i++) b[i] = X[i];
}